

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportjson.cpp
# Opt level: O1

void __thiscall
trun::ResultsReportJSON::PrintPasses
          (ResultsReportJSON *this,
          vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
          *results)

{
  pointer psVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ResultsReportJSON *pRVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  pointer psVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  initializer_list<std::pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  allocator_type local_ee;
  less<trun::kTestResult> local_ed;
  anon_enum_8 local_ec [4];
  ResultsReportJSON *local_e8;
  Ref local_e0;
  pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  if ((this->bHadFailures != false) || (this->bHadSummary == true)) {
    ResultsReportPinterBase::WriteNoIndent(&this->super_ResultsReportPinterBase,",\n");
  }
  ResultsReportPinterBase::WriteLine(&this->super_ResultsReportPinterBase,"\"Passes\":[");
  local_e8 = this;
  ResultsReportPinterBase::PushIndent(&this->super_ResultsReportPinterBase);
  if (PrintPasses(std::vector<std::shared_ptr<trun::TestResult>,std::allocator<std::shared_ptr<trun::TestResult>>>const&)
      ::resultToName_abi_cxx11_ == '\0') {
    iVar4 = __cxa_guard_acquire(&PrintPasses(std::vector<std::shared_ptr<trun::TestResult>,std::allocator<std::shared_ptr<trun::TestResult>>>const&)
                                 ::resultToName_abi_cxx11_);
    if (iVar4 != 0) {
      local_ec[3] = 0;
      std::
      pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<trun::kTestResult,_const_char_(&)[5],_true>
                (&local_d0,local_ec + 3,(char (*) [5])0x1d7087);
      local_ec[2] = 3;
      std::
      pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<trun::kTestResult,_const_char_(&)[8],_true>
                (&local_a8,local_ec + 2,(char (*) [8])"AllFail");
      local_ec[1] = 2;
      std::
      pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<trun::kTestResult,_const_char_(&)[11],_true>
                (&local_80,local_ec + 1,(char (*) [11])"ModuleFail");
      local_ec[0] = kTestResult_TestFail;
      std::
      pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<trun::kTestResult,_const_char_(&)[9],_true>
                (&local_58,local_ec,(char (*) [9])"TestFail");
      __l._M_len = 4;
      __l._M_array = &local_d0;
      std::
      map<trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<trun::kTestResult>,_std::allocator<std::pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map(&PrintPasses(std::vector<std::shared_ptr<trun::TestResult>,std::allocator<std::shared_ptr<trun::TestResult>>>const&)
             ::resultToName_abi_cxx11_,__l,&local_ed,&local_ee);
      lVar5 = -0xa0;
      paVar8 = &local_58.second.field_2;
      do {
        if (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar8->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar8->_M_allocated_capacity)[-2],
                          paVar8->_M_allocated_capacity + 1);
        }
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar8->_M_allocated_capacity + -5);
        lVar5 = lVar5 + 0x28;
      } while (lVar5 != 0);
      __cxa_atexit(std::
                   map<trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<trun::kTestResult>,_std::allocator<std::pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~map,&PrintPasses(std::vector<std::shared_ptr<trun::TestResult>,std::allocator<std::shared_ptr<trun::TestResult>>>const&)
                           ::resultToName_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&PrintPasses(std::vector<std::shared_ptr<trun::TestResult>,std::allocator<std::shared_ptr<trun::TestResult>>>const&)
                           ::resultToName_abi_cxx11_);
    }
  }
  psVar7 = (results->
           super__Vector_base<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (results->
           super__Vector_base<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (psVar7 != psVar1) {
    bVar6 = false;
    do {
      pRVar3 = local_e8;
      peVar2 = (psVar7->super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this_00 = (psVar7->super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      if (peVar2->testResult == kTestResult_Pass) {
        if (bVar6) {
          ResultsReportPinterBase::WriteNoIndent(&local_e8->super_ResultsReportPinterBase,",\n");
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        local_e0.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
        local_e0.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = this_00;
        PrintTestResult(pRVar3,&local_e0);
        bVar6 = true;
        if (local_e0.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_e0.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      psVar7 = psVar7 + 1;
    } while (psVar7 != psVar1);
  }
  pRVar3 = local_e8;
  ResultsReportPinterBase::PopIndent(&local_e8->super_ResultsReportPinterBase);
  ResultsReportPinterBase::WriteLine(&pRVar3->super_ResultsReportPinterBase,"");
  ResultsReportPinterBase::Write(&pRVar3->super_ResultsReportPinterBase,"]");
  pRVar3->bHadSuccess = true;
  return;
}

Assistant:

void ResultsReportJSON::PrintPasses(const std::vector<TestResult::Ref> &results) {
    if (bHadFailures || bHadSummary) {
        WriteNoIndent(",\n");
        //fprintf(fout,",\n");
    }
    WriteLine(R"("Passes":[)");
    PushIndent();
    static std::map<kTestResult, std::string> resultToName={
            {kTestResult_Pass, "Pass"},
            {kTestResult_AllFail, "AllFail"},
            {kTestResult_ModuleFail,"ModuleFail"},
            {kTestResult_TestFail, "TestFail"},
    };
    bool bNeedComma = false;

    for (auto r : results) {
        if (r->Result() != kTestResult_Pass) {
            continue;
        }
        if (bNeedComma) {
            WriteNoIndent(",\n");
        }
        PrintTestResult(r);
        bNeedComma = true;
    }
    PopIndent();
    WriteLine("");
    Write("]");

    bHadSuccess = true;
}